

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O0

void __thiscall
cpptrace::system_error::system_error
          (system_error *this,int error_code,string *message_arg,raw_trace *trace)

{
  int iVar1;
  error_category *peVar2;
  error_code local_98;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  raw_trace *local_28;
  raw_trace *trace_local;
  string *message_arg_local;
  system_error *psStack_10;
  int error_code_local;
  system_error *this_local;
  
  local_28 = trace;
  trace_local = (raw_trace *)message_arg;
  message_arg_local._4_4_ = error_code;
  psStack_10 = this;
  std::operator+(&local_68,message_arg,": ");
  iVar1 = message_arg_local._4_4_;
  peVar2 = (error_category *)std::_V2::generic_category();
  std::error_code::error_code(&local_98,iVar1,peVar2);
  std::error_code::message_abi_cxx11_(&local_88,&local_98);
  std::operator+(&local_48,&local_68,&local_88);
  runtime_error::runtime_error(&this->super_runtime_error,&local_48,local_28);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  iVar1 = message_arg_local._4_4_;
  (this->super_runtime_error).super_exception_with_message.super_lazy_exception.super_exception =
       (exception)&PTR__system_error_003c8028;
  peVar2 = (error_category *)std::_V2::generic_category();
  std::error_code::error_code(&this->ec,iVar1,peVar2);
  return;
}

Assistant:

system_error::system_error(int error_code, std::string&& message_arg, raw_trace&& trace) noexcept
        : runtime_error(
            message_arg + ": " + std::error_code(error_code, std::generic_category()).message(),
            std::move(trace)
          ),
          ec(std::error_code(error_code, std::generic_category())) {}